

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined1 (*pauVar6) [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  undefined4 uVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  undefined4 uVar24;
  RayHit *pRVar23;
  ulong uVar25;
  undefined8 uVar26;
  RTCRayQueryContext *pRVar27;
  uint uVar28;
  Geometry *extraout_RDX;
  Geometry *extraout_RDX_00;
  Geometry *extraout_RDX_01;
  Geometry *extraout_RDX_02;
  Geometry *pGVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  Scene *pSVar33;
  ulong uVar34;
  RayQueryContext *pRVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  RayHit *pRVar40;
  float fVar66;
  float fVar67;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  float fVar78;
  float fVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar80;
  float fVar88;
  float fVar89;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar97;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  float fVar113;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  uint uVar121;
  float fVar122;
  float fVar123;
  float fVar129;
  float fVar132;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar135;
  uint uVar136;
  float fVar140;
  float fVar142;
  undefined1 auVar137 [16];
  uint uVar141;
  undefined1 auVar139 [16];
  float fVar143;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar158;
  undefined1 auVar157 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  undefined1 local_131c [8];
  float fStack_1314;
  undefined1 auStack_1310 [8];
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  RayHit *local_12f8;
  RayQueryContext *local_12f0;
  undefined1 local_12e8 [12];
  float fStack_12dc;
  undefined8 local_12d8;
  uint auStack_12d0 [1];
  uint auStack_12cc [1];
  RTCFilterFunctionNArguments local_12c8;
  long local_1298;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  undefined4 local_1284;
  undefined4 local_1280;
  undefined4 local_127c;
  undefined4 local_1278;
  undefined4 local_1274;
  uint local_1270;
  uint local_126c;
  uint local_1268;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  ulong local_1240;
  ulong local_1238;
  ulong local_1230;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined1 local_11e8 [12];
  float fStack_11dc;
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  long local_10a8;
  long local_10a0;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar138 [16];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar21 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    auVar74._4_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
    auVar74._8_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
    auVar74._12_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar122 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar156._0_4_ = (ray->super_RayK<1>).tfar;
    auVar74._0_4_ = 0.0;
    if (0.0 <= auVar156._0_4_) {
      auVar74._0_4_ = auVar156._0_4_;
    }
    auVar125._4_4_ = -(uint)(ABS(aVar7.y) < 1e-18);
    auVar125._0_4_ = -(uint)(ABS(aVar7.x) < 1e-18);
    auVar125._8_4_ = -(uint)(ABS(aVar7.z) < 1e-18);
    auVar125._12_4_ = -(uint)(ABS(aVar7.field_3.w) < 1e-18);
    auVar156._0_4_ = 0.0;
    if (0.0 <= fVar122) {
      auVar156._0_4_ = fVar122;
    }
    auVar124 = divps(_DAT_01f7ba10,(undefined1  [16])aVar7);
    auVar125 = blendvps(auVar124,_DAT_01fab950,auVar125);
    fVar135 = auVar125._0_4_ * 0.99999964;
    fVar140 = auVar125._4_4_ * 0.99999964;
    fVar142 = auVar125._8_4_ * 0.99999964;
    fVar122 = auVar125._0_4_ * 1.0000004;
    fVar129 = auVar125._4_4_ * 1.0000004;
    fVar132 = auVar125._8_4_ * 1.0000004;
    uVar34 = (ulong)(fVar135 < 0.0) * 0x10;
    uVar36 = (ulong)(fVar140 < 0.0) << 4 | 0x20;
    uVar39 = (ulong)(fVar142 < 0.0) << 4 | 0x40;
    uVar37 = uVar34 ^ 0x10;
    uVar38 = uVar36 ^ 0x10;
    uVar31 = uVar39 ^ 0x10;
    auVar124._4_4_ = auVar74._0_4_;
    auVar124._0_4_ = auVar74._0_4_;
    auVar124._8_4_ = auVar74._0_4_;
    auVar124._12_4_ = auVar74._0_4_;
    local_fe8 = mm_lookupmask_ps._0_8_;
    uStack_fe0 = mm_lookupmask_ps._8_8_;
    local_ff8 = mm_lookupmask_ps._240_8_;
    uStack_ff0 = mm_lookupmask_ps._248_8_;
    local_12f0 = context;
    local_12f8 = ray;
    local_1230 = uVar39;
    local_1008 = auVar74._12_4_;
    fStack_1004 = auVar74._12_4_;
    fStack_1000 = auVar74._12_4_;
    fStack_ffc = auVar74._12_4_;
    local_1018 = auVar156._0_4_;
    fStack_1014 = auVar156._0_4_;
    fStack_1010 = auVar156._0_4_;
    fStack_100c = auVar156._0_4_;
    local_1028 = fVar132;
    fStack_1024 = fVar132;
    fStack_1020 = fVar132;
    fStack_101c = fVar132;
    local_1038 = fVar142;
    fStack_1034 = fVar142;
    fStack_1030 = fVar142;
    fStack_102c = fVar142;
    local_1048 = auVar74._4_4_;
    fStack_1044 = auVar74._4_4_;
    fStack_1040 = auVar74._4_4_;
    fStack_103c = auVar74._4_4_;
    local_1058 = auVar74._8_4_;
    fStack_1054 = auVar74._8_4_;
    fStack_1050 = auVar74._8_4_;
    fStack_104c = auVar74._8_4_;
    local_1068 = fVar135;
    fStack_1064 = fVar135;
    fStack_1060 = fVar135;
    fStack_105c = fVar135;
    local_1078 = fVar140;
    fStack_1074 = fVar140;
    fStack_1070 = fVar140;
    fStack_106c = fVar140;
    local_1088 = fVar122;
    fStack_1084 = fVar122;
    fStack_1080 = fVar122;
    fStack_107c = fVar122;
    local_1098 = fVar129;
    fStack_1094 = fVar129;
    fStack_1090 = fVar129;
    fStack_108c = fVar129;
    local_1238 = uVar37;
    local_1240 = uVar38;
    auVar74._0_4_ = fVar122;
    fVar66 = fVar122;
    fVar67 = fVar122;
    fVar78 = fVar129;
    fVar79 = fVar129;
    fVar80 = fVar129;
    fVar149 = fVar140;
    fVar148 = fVar140;
    fVar147 = fVar140;
    fVar143 = fVar135;
    fVar134 = fVar135;
    fVar133 = fVar135;
    fVar131 = auVar74._4_4_;
    fVar130 = auVar74._4_4_;
    fVar123 = auVar74._4_4_;
    fVar120 = fVar142;
    fVar119 = fVar142;
    fVar118 = fVar142;
    fVar117 = fVar132;
    fVar116 = fVar132;
    fVar113 = fVar132;
    fVar112 = auVar74._12_4_;
    fVar111 = auVar74._12_4_;
    fVar110 = auVar74._12_4_;
    fVar109 = auVar74._8_4_;
    fVar106 = auVar74._8_4_;
    fVar97 = auVar74._8_4_;
    fVar90 = auVar156._0_4_;
    fVar89 = auVar156._0_4_;
    fVar88 = auVar156._0_4_;
    pRVar35 = context;
LAB_00d9a917:
    do {
      pauVar6 = pauVar21 + -1;
      pauVar21 = pauVar21 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar6 + 8) < *pfVar1 || *(float *)((long)*pauVar6 + 8) == *pfVar1) {
        uVar30 = *(ulong *)*pauVar21;
        while ((uVar30 & 8) == 0) {
          pfVar1 = (float *)(uVar30 + 0x20 + uVar34);
          auVar93._0_4_ = (*pfVar1 - fVar123) * fVar133;
          auVar93._4_4_ = (pfVar1[1] - fVar130) * fVar134;
          auVar93._8_4_ = (pfVar1[2] - fVar131) * fVar143;
          auVar93._12_4_ = (pfVar1[3] - auVar74._4_4_) * fVar135;
          pfVar1 = (float *)(uVar30 + 0x20 + uVar36);
          auVar103._0_4_ = (*pfVar1 - fVar97) * fVar147;
          auVar103._4_4_ = (pfVar1[1] - fVar106) * fVar148;
          auVar103._8_4_ = (pfVar1[2] - fVar109) * fVar149;
          auVar103._12_4_ = (pfVar1[3] - auVar74._8_4_) * fVar140;
          auVar125 = maxps(auVar93,auVar103);
          pfVar1 = (float *)(uVar30 + 0x20 + uVar39);
          auVar69._0_4_ = (*pfVar1 - fVar110) * fVar118;
          auVar69._4_4_ = (pfVar1[1] - fVar111) * fVar119;
          auVar69._8_4_ = (pfVar1[2] - fVar112) * fVar120;
          auVar69._12_4_ = (pfVar1[3] - auVar74._12_4_) * fVar142;
          auVar70._4_4_ = fVar89;
          auVar70._0_4_ = fVar88;
          auVar70._8_4_ = fVar90;
          auVar70._12_4_ = auVar156._0_4_;
          auVar70 = maxps(auVar69,auVar70);
          _local_11e8 = maxps(auVar125,auVar70);
          pfVar1 = (float *)(uVar30 + 0x20 + uVar37);
          auVar71._0_4_ = (*pfVar1 - fVar123) * fVar122;
          auVar71._4_4_ = (pfVar1[1] - fVar130) * auVar74._0_4_;
          auVar71._8_4_ = (pfVar1[2] - fVar131) * fVar66;
          auVar71._12_4_ = (pfVar1[3] - auVar74._4_4_) * fVar67;
          pfVar1 = (float *)(uVar30 + 0x20 + uVar38);
          auVar81._0_4_ = (*pfVar1 - fVar97) * fVar129;
          auVar81._4_4_ = (pfVar1[1] - fVar106) * fVar78;
          auVar81._8_4_ = (pfVar1[2] - fVar109) * fVar79;
          auVar81._12_4_ = (pfVar1[3] - auVar74._8_4_) * fVar80;
          auVar125 = minps(auVar71,auVar81);
          pfVar1 = (float *)(uVar30 + 0x20 + uVar31);
          auVar82._0_4_ = (*pfVar1 - fVar110) * fVar113;
          auVar82._4_4_ = (pfVar1[1] - fVar111) * fVar116;
          auVar82._8_4_ = (pfVar1[2] - fVar112) * fVar117;
          auVar82._12_4_ = (pfVar1[3] - auVar74._12_4_) * fVar132;
          auVar70 = minps(auVar82,auVar124);
          auVar125 = minps(auVar125,auVar70);
          auVar99._4_4_ = -(uint)(local_11e8._4_4_ <= auVar125._4_4_);
          auVar99._0_4_ = -(uint)(local_11e8._0_4_ <= auVar125._0_4_);
          auVar99._8_4_ = -(uint)(local_11e8._8_4_ <= auVar125._8_4_);
          auVar99._12_4_ = -(uint)(local_11e8._12_4_ <= auVar125._12_4_);
          uVar28 = movmskps((int)context,auVar99);
          context = (RayQueryContext *)(ulong)uVar28;
          if (uVar28 == 0) {
            if (pauVar21 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d9a917;
          }
          uVar25 = uVar30 & 0xfffffffffffffff0;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar28 != 0) {
            for (; ((byte)uVar28 >> (long)context & 1) == 0;
                context = (RayQueryContext *)
                          ((long)&(((Geometry *)context)->super_RefCount)._vptr_RefCount + 1)) {
            }
          }
          uVar30 = *(ulong *)(uVar25 + (long)context * 8);
          uVar28 = (uVar28 & 0xff) - 1 & uVar28 & 0xff;
          if (uVar28 != 0) {
            uVar136 = *(uint *)(local_11e8 + (long)context * 4);
            lVar32 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            uVar10 = *(ulong *)(uVar25 + lVar32 * 8);
            uVar141 = *(uint *)(local_11e8 + lVar32 * 4);
            uVar28 = uVar28 - 1 & uVar28;
            context = (RayQueryContext *)(ulong)uVar28;
            if (uVar28 == 0) {
              if (uVar136 < uVar141) {
                *(ulong *)*pauVar21 = uVar10;
                *(uint *)((long)*pauVar21 + 8) = uVar141;
                pauVar21 = pauVar21 + 1;
              }
              else {
                *(ulong *)*pauVar21 = uVar30;
                *(uint *)((long)*pauVar21 + 8) = uVar136;
                pauVar21 = pauVar21 + 1;
                uVar30 = uVar10;
              }
            }
            else {
              auVar72._8_4_ = uVar136;
              auVar72._0_8_ = uVar30;
              auVar72._12_4_ = 0;
              auVar91._8_4_ = uVar141;
              auVar91._0_8_ = uVar10;
              auVar91._12_4_ = 0;
              lVar32 = 0;
              if ((Geometry *)context != (Geometry *)0x0) {
                for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              uVar26 = *(undefined8 *)(uVar25 + lVar32 * 8);
              iVar19 = *(int *)(local_11e8 + lVar32 * 4);
              auVar83._8_4_ = iVar19;
              auVar83._0_8_ = uVar26;
              auVar83._12_4_ = 0;
              auVar41._8_4_ = -(uint)((int)uVar136 < (int)uVar141);
              uVar28 = uVar28 - 1 & uVar28;
              if (uVar28 == 0) {
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar98._8_4_ = uVar141;
                auVar98._0_8_ = uVar10;
                auVar98._12_4_ = 0;
                auVar70 = blendvps(auVar98,auVar72,auVar41);
                auVar125 = blendvps(auVar72,auVar91,auVar41);
                auVar42._8_4_ = -(uint)(auVar70._8_4_ < iVar19);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar92._8_4_ = iVar19;
                auVar92._0_8_ = uVar26;
                auVar92._12_4_ = 0;
                auVar93 = blendvps(auVar92,auVar70,auVar42);
                auVar99 = blendvps(auVar70,auVar83,auVar42);
                auVar43._8_4_ = -(uint)(auVar125._8_4_ < auVar99._8_4_);
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar70 = blendvps(auVar99,auVar125,auVar43);
                auVar125 = blendvps(auVar125,auVar99,auVar43);
                *pauVar21 = auVar125;
                pauVar21[1] = auVar70;
                uVar30 = auVar93._0_8_;
                pauVar21 = pauVar21 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)
                                ((long)&(((Geometry *)context)->super_RefCount)._vptr_RefCount + 1))
                  {
                  }
                }
                auVar44._4_4_ = auVar41._8_4_;
                auVar44._0_4_ = auVar41._8_4_;
                auVar44._8_4_ = auVar41._8_4_;
                auVar44._12_4_ = auVar41._8_4_;
                auVar99 = blendvps(auVar91,auVar72,auVar44);
                auVar125 = blendvps(auVar72,auVar91,auVar44);
                auVar102._8_4_ = *(int *)(local_11e8 + (long)context * 4);
                auVar102._0_8_ = *(undefined8 *)(uVar25 + (long)context * 8);
                auVar102._12_4_ = 0;
                auVar45._8_4_ = -(uint)(iVar19 < *(int *)(local_11e8 + (long)context * 4));
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar93 = blendvps(auVar102,auVar83,auVar45);
                auVar70 = blendvps(auVar83,auVar102,auVar45);
                auVar46._8_4_ = -(uint)(auVar125._8_4_ < auVar70._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar103 = blendvps(auVar70,auVar125,auVar46);
                auVar125 = blendvps(auVar125,auVar70,auVar46);
                auVar47._8_4_ = -(uint)(auVar99._8_4_ < auVar93._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar70 = blendvps(auVar93,auVar99,auVar47);
                auVar99 = blendvps(auVar99,auVar93,auVar47);
                auVar48._8_4_ = -(uint)(auVar99._8_4_ < auVar103._8_4_);
                auVar48._4_4_ = auVar48._8_4_;
                auVar48._0_4_ = auVar48._8_4_;
                auVar48._12_4_ = auVar48._8_4_;
                auVar93 = blendvps(auVar103,auVar99,auVar48);
                auVar99 = blendvps(auVar99,auVar103,auVar48);
                *pauVar21 = auVar125;
                pauVar21[1] = auVar99;
                pauVar21[2] = auVar93;
                uVar30 = auVar70._0_8_;
                pauVar21 = pauVar21 + 3;
                fVar122 = local_1088;
                auVar74._0_4_ = fStack_1084;
                fVar66 = fStack_1080;
                fVar67 = fStack_107c;
                fVar129 = local_1098;
                fVar78 = fStack_1094;
                fVar79 = fStack_1090;
                fVar80 = fStack_108c;
              }
            }
          }
        }
        local_10a8 = (ulong)((uint)uVar30 & 0xf) - 8;
        if (local_10a8 != 0) {
          uVar30 = uVar30 & 0xfffffffffffffff0;
          local_10a0 = 0;
          do {
            lVar22 = local_10a0 * 0xe0;
            puVar5 = (undefined8 *)(uVar30 + 0xd0 + lVar22);
            local_11f8 = *puVar5;
            uStack_11f0 = puVar5[1];
            auVar156._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
            auVar74._0_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
            auVar74._4_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
            pfVar1 = (float *)(uVar30 + lVar22);
            pfVar2 = (float *)(uVar30 + 0x10 + lVar22);
            pfVar3 = (float *)(uVar30 + 0x20 + lVar22);
            pfVar4 = (float *)(uVar30 + 0x30 + lVar22);
            local_1208 = *pfVar4;
            fStack_1204 = pfVar4[1];
            fStack_1200 = pfVar4[2];
            fStack_11fc = pfVar4[3];
            fVar143 = *pfVar1 - auVar156._0_4_;
            fVar147 = pfVar1[1] - auVar156._0_4_;
            auStack_12d0[0] = (uint)(pfVar1[2] - auVar156._0_4_);
            auStack_12cc[0] = (uint)(pfVar1[3] - auVar156._0_4_);
            local_10b8 = *pfVar2 - auVar74._0_4_;
            fStack_10b4 = pfVar2[1] - auVar74._0_4_;
            fStack_10b0 = pfVar2[2] - auVar74._0_4_;
            fStack_10ac = pfVar2[3] - auVar74._0_4_;
            local_10c8 = *pfVar3 - auVar74._4_4_;
            fStack_10c4 = pfVar3[1] - auVar74._4_4_;
            fStack_10c0 = pfVar3[2] - auVar74._4_4_;
            fStack_10bc = pfVar3[3] - auVar74._4_4_;
            fVar142 = local_1208 - auVar156._0_4_;
            fVar130 = fStack_1204 - auVar156._0_4_;
            fVar133 = fStack_1200 - auVar156._0_4_;
            fVar134 = fStack_11fc - auVar156._0_4_;
            pfVar1 = (float *)(uVar30 + 0x40 + lVar22);
            local_1228 = *pfVar1;
            fStack_1224 = pfVar1[1];
            fStack_1220 = pfVar1[2];
            fStack_121c = pfVar1[3];
            fVar90 = local_1228 - auVar74._0_4_;
            fVar97 = fStack_1224 - auVar74._0_4_;
            fStack_1290 = fStack_1220 - auVar74._0_4_;
            fStack_128c = fStack_121c - auVar74._0_4_;
            pfVar1 = (float *)(uVar30 + 0x50 + lVar22);
            local_1218 = *pfVar1;
            fStack_1214 = pfVar1[1];
            fStack_1210 = pfVar1[2];
            fStack_120c = pfVar1[3];
            fVar112 = local_1218 - auVar74._4_4_;
            fVar116 = fStack_1214 - auVar74._4_4_;
            fVar132 = fStack_1210 - auVar74._4_4_;
            fVar119 = fStack_120c - auVar74._4_4_;
            pfVar1 = (float *)(uVar30 + 0x90 + lVar22);
            stack0xffffffffffffece8 = *(Geometry **)pfVar1;
            auStack_1310 = (undefined1  [8])*(long *)(pfVar1 + 2);
            fVar122 = *pfVar1 - auVar156._0_4_;
            fVar66 = pfVar1[1] - auVar156._0_4_;
            fVar67 = pfVar1[2] - auVar156._0_4_;
            auVar156._0_4_ = pfVar1[3] - auVar156._0_4_;
            pfVar1 = (float *)(uVar30 + 0xa0 + lVar22);
            _local_1308 = *(undefined8 *)pfVar1;
            _fStack_1300 = *(undefined8 *)(pfVar1 + 2);
            fVar80 = *pfVar1 - auVar74._0_4_;
            fVar88 = pfVar1[1] - auVar74._0_4_;
            fVar89 = pfVar1[2] - auVar74._0_4_;
            auVar74._0_4_ = pfVar1[3] - auVar74._0_4_;
            pauVar6 = (undefined1 (*) [16])(uVar30 + 0xb0 + lVar22);
            auVar125 = *pauVar6;
            fVar129 = *(float *)*pauVar6 - auVar74._4_4_;
            fVar78 = *(float *)(*pauVar6 + 4) - auVar74._4_4_;
            fVar79 = *(float *)(*pauVar6 + 8) - auVar74._4_4_;
            auVar74._4_4_ = *(float *)(*pauVar6 + 0xc) - auVar74._4_4_;
            local_10d8._0_4_ = fVar122 - fVar143;
            local_10d8._4_4_ = fVar66 - fVar147;
            fStack_10d0 = fVar67 - (float)auStack_12d0[0];
            fStack_10cc = auVar156._0_4_ - (float)auStack_12cc[0];
            local_10f8 = fVar80 - local_10b8;
            fStack_10f4 = fVar88 - fStack_10b4;
            fStack_10f0 = fVar89 - fStack_10b0;
            fStack_10ec = auVar74._0_4_ - fStack_10ac;
            local_10e8 = fVar129 - local_10c8;
            fStack_10e4 = fVar78 - fStack_10c4;
            fStack_10e0 = fVar79 - fStack_10c0;
            fStack_10dc = auVar74._4_4_ - fStack_10bc;
            local_12d8 = (Scene *)CONCAT44(fVar147,fVar143);
            auVar74._8_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar74._12_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_1258 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar123 = (local_10f8 * (local_10c8 + fVar129) - (local_10b8 + fVar80) * local_10e8) *
                      auVar74._8_4_ +
                      ((fVar143 + fVar122) * local_10e8 -
                      (local_10c8 + fVar129) * (float)local_10d8._0_4_) * auVar74._12_4_ +
                      ((float)local_10d8._0_4_ * (local_10b8 + fVar80) -
                      (fVar143 + fVar122) * local_10f8) * local_1258;
            fVar131 = (fStack_10f4 * (fStack_10c4 + fVar78) - (fStack_10b4 + fVar88) * fStack_10e4)
                      * auVar74._8_4_ +
                      ((fVar147 + fVar66) * fStack_10e4 -
                      (fStack_10c4 + fVar78) * (float)local_10d8._4_4_) * auVar74._12_4_ +
                      ((float)local_10d8._4_4_ * (fStack_10b4 + fVar88) -
                      (fVar147 + fVar66) * fStack_10f4) * local_1258;
            local_fa8._0_8_ = CONCAT44(fVar131,fVar123);
            local_fa8._8_4_ =
                 (fStack_10f0 * (fStack_10c0 + fVar79) - (fStack_10b0 + fVar89) * fStack_10e0) *
                 auVar74._8_4_ +
                 (((float)auStack_12d0[0] + fVar67) * fStack_10e0 -
                 (fStack_10c0 + fVar79) * fStack_10d0) * auVar74._12_4_ +
                 (fStack_10d0 * (fStack_10b0 + fVar89) -
                 ((float)auStack_12d0[0] + fVar67) * fStack_10f0) * local_1258;
            local_fa8._12_4_ =
                 (fStack_10ec * (fStack_10bc + auVar74._4_4_) -
                 (fStack_10ac + auVar74._0_4_) * fStack_10dc) * auVar74._8_4_ +
                 (((float)auStack_12cc[0] + auVar156._0_4_) * fStack_10dc -
                 (fStack_10bc + auVar74._4_4_) * fStack_10cc) * auVar74._12_4_ +
                 (fStack_10cc * (fStack_10ac + auVar74._0_4_) -
                 ((float)auStack_12cc[0] + auVar156._0_4_) * fStack_10ec) * local_1258;
            local_f88 = fVar143 - fVar142;
            fStack_f84 = fVar147 - fVar130;
            fStack_f80 = (float)auStack_12d0[0] - fVar133;
            fStack_f7c = (float)auStack_12cc[0] - fVar134;
            fVar113 = local_10b8 - fVar90;
            fVar117 = fStack_10b4 - fVar97;
            fVar118 = fStack_10b0 - fStack_1290;
            fVar120 = fStack_10ac - fStack_128c;
            fVar106 = local_10c8 - fVar112;
            fVar109 = fStack_10c4 - fVar116;
            fVar110 = fStack_10c0 - fVar132;
            fVar111 = fStack_10bc - fVar119;
            local_f98 = (fVar113 * (local_10c8 + fVar112) - (local_10b8 + fVar90) * fVar106) *
                        auVar74._8_4_ +
                        ((fVar143 + fVar142) * fVar106 - (local_10c8 + fVar112) * local_f88) *
                        auVar74._12_4_ +
                        (local_f88 * (local_10b8 + fVar90) - (fVar143 + fVar142) * fVar113) *
                        local_1258;
            fStack_f94 = (fVar117 * (fStack_10c4 + fVar116) - (fStack_10b4 + fVar97) * fVar109) *
                         auVar74._8_4_ +
                         ((fVar147 + fVar130) * fVar109 - (fStack_10c4 + fVar116) * fStack_f84) *
                         auVar74._12_4_ +
                         (fStack_f84 * (fStack_10b4 + fVar97) - (fVar147 + fVar130) * fVar117) *
                         local_1258;
            fStack_f90 = (fVar118 * (fStack_10c0 + fVar132) - (fStack_10b0 + fStack_1290) * fVar110)
                         * auVar74._8_4_ +
                         (((float)auStack_12d0[0] + fVar133) * fVar110 -
                         (fStack_10c0 + fVar132) * fStack_f80) * auVar74._12_4_ +
                         (fStack_f80 * (fStack_10b0 + fStack_1290) -
                         ((float)auStack_12d0[0] + fVar133) * fVar118) * local_1258;
            fStack_f8c = (fVar120 * (fStack_10bc + fVar119) - (fStack_10ac + fStack_128c) * fVar111)
                         * auVar74._8_4_ +
                         (((float)auStack_12cc[0] + fVar134) * fVar111 -
                         (fStack_10bc + fVar119) * fStack_f7c) * auVar74._12_4_ +
                         (fStack_f7c * (fStack_10ac + fStack_128c) -
                         ((float)auStack_12cc[0] + fVar134) * fVar120) * local_1258;
            fVar135 = fVar142 - fVar122;
            fVar148 = fVar130 - fVar66;
            fVar149 = fVar133 - fVar67;
            fVar140 = fVar134 - auVar156._0_4_;
            fVar150 = fVar90 - fVar80;
            fVar152 = fVar97 - fVar88;
            fVar153 = fStack_1290 - fVar89;
            fVar154 = fStack_128c - auVar74._0_4_;
            local_1108 = fVar112 - fVar129;
            fStack_1104 = fVar116 - fVar78;
            fStack_1100 = fVar132 - fVar79;
            fStack_10fc = fVar119 - auVar74._4_4_;
            fStack_1254 = local_1258;
            fStack_1250 = local_1258;
            fStack_124c = local_1258;
            fVar129 = (fVar150 * (fVar129 + fVar112) - (fVar80 + fVar90) * local_1108) *
                      auVar74._8_4_ +
                      ((fVar122 + fVar142) * local_1108 - (fVar129 + fVar112) * fVar135) *
                      auVar74._12_4_ +
                      (fVar135 * (fVar80 + fVar90) - (fVar122 + fVar142) * fVar150) * local_1258;
            fVar66 = (fVar152 * (fVar78 + fVar116) - (fVar88 + fVar97) * fStack_1104) *
                     auVar74._8_4_ +
                     ((fVar66 + fVar130) * fStack_1104 - (fVar78 + fVar116) * fVar148) *
                     auVar74._12_4_ +
                     (fVar148 * (fVar88 + fVar97) - (fVar66 + fVar130) * fVar152) * local_1258;
            fVar67 = (fVar153 * (fVar79 + fVar132) - (fVar89 + fStack_1290) * fStack_1100) *
                     auVar74._8_4_ +
                     ((fVar67 + fVar133) * fStack_1100 - (fVar79 + fVar132) * fVar149) *
                     auVar74._12_4_ +
                     (fVar149 * (fVar89 + fStack_1290) - (fVar67 + fVar133) * fVar153) * local_1258;
            fVar78 = (fVar154 * (auVar74._4_4_ + fVar119) -
                     (auVar74._0_4_ + fStack_128c) * fStack_10fc) * auVar74._8_4_ +
                     ((auVar156._0_4_ + fVar134) * fStack_10fc - (auVar74._4_4_ + fVar119) * fVar140
                     ) * auVar74._12_4_ +
                     (fVar140 * (auVar74._0_4_ + fStack_128c) - (auVar156._0_4_ + fVar134) * fVar154
                     ) * local_1258;
            auVar156._0_4_ = local_f98 + fVar123 + fVar129;
            auVar74._0_4_ = fStack_f94 + fVar131 + fVar66;
            auVar74._4_4_ = fStack_f90 + local_fa8._8_4_ + fVar67;
            fVar122 = fStack_f8c + local_fa8._12_4_ + fVar78;
            auVar49._8_4_ = local_fa8._8_4_;
            auVar49._0_8_ = local_fa8._0_8_;
            auVar49._12_4_ = local_fa8._12_4_;
            auVar11._4_4_ = fStack_f94;
            auVar11._0_4_ = local_f98;
            auVar11._8_4_ = fStack_f90;
            auVar11._12_4_ = fStack_f8c;
            auVar124 = minps(auVar49,auVar11);
            auVar17._4_4_ = fVar66;
            auVar17._0_4_ = fVar129;
            auVar17._8_4_ = fVar67;
            auVar17._12_4_ = fVar78;
            auVar124 = minps(auVar124,auVar17);
            auVar12._4_4_ = fStack_f94;
            auVar12._0_4_ = local_f98;
            auVar12._8_4_ = fStack_f90;
            auVar12._12_4_ = fStack_f8c;
            auVar70 = maxps(local_fa8,auVar12);
            auVar18._4_4_ = fVar66;
            auVar18._0_4_ = fVar129;
            auVar18._8_4_ = fVar67;
            auVar18._12_4_ = fVar78;
            auVar70 = maxps(auVar70,auVar18);
            fVar66 = ABS(auVar156._0_4_) * 1.1920929e-07;
            fVar67 = ABS(auVar74._0_4_) * 1.1920929e-07;
            fVar129 = ABS(auVar74._4_4_) * 1.1920929e-07;
            fVar78 = ABS(fVar122) * 1.1920929e-07;
            auVar126._4_4_ = -(uint)(auVar70._4_4_ <= fVar67);
            auVar126._0_4_ = -(uint)(auVar70._0_4_ <= fVar66);
            auVar126._8_4_ = -(uint)(auVar70._8_4_ <= fVar129);
            auVar126._12_4_ = -(uint)(auVar70._12_4_ <= fVar78);
            auVar50._4_4_ = -(uint)(-fVar67 <= auVar124._4_4_);
            auVar50._0_4_ = -(uint)(-fVar66 <= auVar124._0_4_);
            auVar50._8_4_ = -(uint)(-fVar129 <= auVar124._8_4_);
            auVar50._12_4_ = -(uint)(-fVar78 <= auVar124._12_4_);
            auVar126 = auVar126 | auVar50;
            lVar32 = uVar30 + lVar22;
            uVar24 = (undefined4)((ulong)lVar22 >> 0x20);
            iVar19 = movmskps((int)lVar22,auVar126);
            local_1298 = lVar32;
            local_1348 = auVar125._0_4_;
            fStack_1344 = auVar125._4_4_;
            fStack_1340 = auVar125._8_4_;
            fStack_133c = auVar125._12_4_;
            if (iVar19 == 0) {
              uVar28 = 0;
            }
            else {
              local_fd8 = auVar156._0_4_;
              fStack_fd4 = auVar74._0_4_;
              fStack_fd0 = auVar74._4_4_;
              fStack_fcc = fVar122;
              local_fc8 = fVar135;
              fStack_fc4 = fVar148;
              fStack_fc0 = fVar149;
              fStack_fbc = fVar140;
              local_fb8 = fVar150;
              fStack_fb4 = fVar152;
              fStack_fb0 = fVar153;
              fStack_fac = fVar154;
              auVar104._0_4_ = local_10f8 * fVar106 - fVar113 * local_10e8;
              auVar104._4_4_ = fStack_10f4 * fVar109 - fVar117 * fStack_10e4;
              auVar104._8_4_ = fStack_10f0 * fVar110 - fVar118 * fStack_10e0;
              auVar104._12_4_ = fStack_10ec * fVar111 - fVar120 * fStack_10dc;
              auVar114._0_4_ = fVar113 * local_1108 - fVar106 * fVar150;
              auVar114._4_4_ = fVar117 * fStack_1104 - fVar109 * fVar152;
              auVar114._8_4_ = fVar118 * fStack_1100 - fVar110 * fVar153;
              auVar114._12_4_ = fVar120 * fStack_10fc - fVar111 * fVar154;
              auVar51._4_4_ = -(uint)(ABS(fVar117 * fStack_10e4) < ABS(fVar109 * fVar152));
              auVar51._0_4_ = -(uint)(ABS(fVar113 * local_10e8) < ABS(fVar106 * fVar150));
              auVar51._8_4_ = -(uint)(ABS(fVar118 * fStack_10e0) < ABS(fVar110 * fVar153));
              auVar51._12_4_ = -(uint)(ABS(fVar120 * fStack_10dc) < ABS(fVar111 * fVar154));
              local_11b8 = blendvps(auVar114,auVar104,auVar51);
              auVar144._0_4_ = local_10e8 * local_f88 - fVar106 * (float)local_10d8._0_4_;
              auVar144._4_4_ = fStack_10e4 * fStack_f84 - fVar109 * (float)local_10d8._4_4_;
              auVar144._8_4_ = fStack_10e0 * fStack_f80 - fVar110 * fStack_10d0;
              auVar144._12_4_ = fStack_10dc * fStack_f7c - fVar111 * fStack_10cc;
              auVar107._0_4_ = fVar106 * fVar135 - local_f88 * local_1108;
              auVar107._4_4_ = fVar109 * fVar148 - fStack_f84 * fStack_1104;
              auVar107._8_4_ = fVar110 * fVar149 - fStack_f80 * fStack_1100;
              auVar107._12_4_ = fVar111 * fVar140 - fStack_f7c * fStack_10fc;
              auVar52._4_4_ =
                   -(uint)(ABS(fVar109 * (float)local_10d8._4_4_) < ABS(fStack_f84 * fStack_1104));
              auVar52._0_4_ =
                   -(uint)(ABS(fVar106 * (float)local_10d8._0_4_) < ABS(local_f88 * local_1108));
              auVar52._8_4_ = -(uint)(ABS(fVar110 * fStack_10d0) < ABS(fStack_f80 * fStack_1100));
              auVar52._12_4_ = -(uint)(ABS(fVar111 * fStack_10cc) < ABS(fStack_f7c * fStack_10fc));
              local_11a8 = blendvps(auVar107,auVar144,auVar52);
              auVar94._0_4_ = local_f88 * fVar150 - fVar113 * fVar135;
              auVar94._4_4_ = fStack_f84 * fVar152 - fVar117 * fVar148;
              auVar94._8_4_ = fStack_f80 * fVar153 - fVar118 * fVar149;
              auVar94._12_4_ = fStack_f7c * fVar154 - fVar120 * fVar140;
              auVar53._4_4_ = -(uint)(ABS(fStack_f84 * fStack_10f4) < ABS(fVar117 * fVar148));
              auVar53._0_4_ = -(uint)(ABS(local_f88 * local_10f8) < ABS(fVar113 * fVar135));
              auVar53._8_4_ = -(uint)(ABS(fStack_f80 * fStack_10f0) < ABS(fVar118 * fVar149));
              auVar53._12_4_ = -(uint)(ABS(fStack_f7c * fStack_10ec) < ABS(fVar120 * fVar140));
              auVar13._4_4_ = (float)local_10d8._4_4_ * fVar117 - fStack_f84 * fStack_10f4;
              auVar13._0_4_ = (float)local_10d8._0_4_ * fVar113 - local_f88 * local_10f8;
              auVar13._8_4_ = fStack_10d0 * fVar118 - fStack_f80 * fStack_10f0;
              auVar13._12_4_ = fStack_10cc * fVar120 - fStack_f7c * fStack_10ec;
              local_1198 = blendvps(auVar94,auVar13,auVar53);
              fVar66 = auVar74._8_4_ * local_11b8._0_4_ +
                       auVar74._12_4_ * local_11a8._0_4_ + local_1258 * local_1198._0_4_;
              fVar67 = auVar74._8_4_ * local_11b8._4_4_ +
                       auVar74._12_4_ * local_11a8._4_4_ + local_1258 * local_1198._4_4_;
              fVar129 = auVar74._8_4_ * local_11b8._8_4_ +
                        auVar74._12_4_ * local_11a8._8_4_ + local_1258 * local_1198._8_4_;
              auVar74._8_4_ =
                   auVar74._8_4_ * local_11b8._12_4_ +
                   auVar74._12_4_ * local_11a8._12_4_ + local_1258 * local_1198._12_4_;
              auVar137._0_4_ = fVar66 + fVar66;
              auVar137._4_4_ = fVar67 + fVar67;
              auVar137._8_4_ = fVar129 + fVar129;
              auVar137._12_4_ = auVar74._8_4_ + auVar74._8_4_;
              auVar54._0_4_ = local_10b8 * local_11a8._0_4_ + local_10c8 * local_1198._0_4_;
              auVar54._4_4_ = fStack_10b4 * local_11a8._4_4_ + fStack_10c4 * local_1198._4_4_;
              auVar54._8_4_ = fStack_10b0 * local_11a8._8_4_ + fStack_10c0 * local_1198._8_4_;
              auVar54._12_4_ = fStack_10ac * local_11a8._12_4_ + fStack_10bc * local_1198._12_4_;
              auVar74._8_4_ = fVar143 * local_11b8._0_4_ + auVar54._0_4_;
              auVar74._12_4_ = fVar147 * local_11b8._4_4_ + auVar54._4_4_;
              fVar66 = (float)auStack_12d0[0] * local_11b8._8_4_ + auVar54._8_4_;
              fVar67 = (float)auStack_12cc[0] * local_11b8._12_4_ + auVar54._12_4_;
              auVar95._0_4_ = auVar74._8_4_ + auVar74._8_4_;
              auVar95._4_4_ = auVar74._12_4_ + auVar74._12_4_;
              auVar95._8_4_ = fVar66 + fVar66;
              auVar95._12_4_ = fVar67 + fVar67;
              auVar125 = rcpps(auVar54,auVar137);
              auVar74._8_4_ = auVar125._0_4_;
              auVar74._12_4_ = auVar125._4_4_;
              fVar66 = auVar125._8_4_;
              fVar67 = auVar125._12_4_;
              auVar145._0_4_ =
                   ((1.0 - auVar137._0_4_ * auVar74._8_4_) * auVar74._8_4_ + auVar74._8_4_) *
                   auVar95._0_4_;
              auVar145._4_4_ =
                   ((1.0 - auVar137._4_4_ * auVar74._12_4_) * auVar74._12_4_ + auVar74._12_4_) *
                   auVar95._4_4_;
              auVar145._8_4_ = ((1.0 - auVar137._8_4_ * fVar66) * fVar66 + fVar66) * auVar95._8_4_;
              auVar145._12_4_ =
                   ((1.0 - auVar137._12_4_ * fVar67) * fVar67 + fVar67) * auVar95._12_4_;
              auVar8._0_4_ = (ray->super_RayK<1>).tfar;
              auVar8._4_4_ = (ray->super_RayK<1>).mask;
              auVar8._8_4_ = (ray->super_RayK<1>).id;
              auVar8._12_4_ = (ray->super_RayK<1>).flags;
              auVar74._8_4_ = (ray->super_RayK<1>).org.field_0.m128[3];
              uVar136 = -(uint)(auVar137._0_4_ != 0.0) & auVar126._0_4_ &
                        -(uint)(auVar145._0_4_ <= (float)auVar8._0_4_ &&
                               auVar74._8_4_ <= auVar145._0_4_);
              uVar141 = -(uint)(auVar137._4_4_ != 0.0) & auVar126._4_4_ &
                        -(uint)(auVar145._4_4_ <= (float)auVar8._0_4_ &&
                               auVar74._8_4_ <= auVar145._4_4_);
              auVar138._0_8_ = CONCAT44(uVar141,uVar136);
              auVar138._8_4_ =
                   -(uint)(auVar137._8_4_ != 0.0) & auVar126._8_4_ &
                   -(uint)(auVar145._8_4_ <= (float)auVar8._0_4_ && auVar74._8_4_ <= auVar145._8_4_)
              ;
              auVar138._12_4_ =
                   -(uint)(auVar137._12_4_ != 0.0) & auVar126._12_4_ &
                   -(uint)(auVar145._12_4_ <= (float)auVar8._0_4_ &&
                          auVar74._8_4_ <= auVar145._12_4_);
              uVar28 = movmskps(iVar19,auVar138);
              if (uVar28 != 0) {
                local_11e8._8_4_ = local_fa8._8_4_;
                local_11e8._0_8_ = local_fa8._0_8_;
                fStack_11dc = local_fa8._12_4_;
                local_11d8._4_4_ = fStack_f94;
                local_11d8._0_4_ = local_f98;
                fStack_11d0 = fStack_f90;
                fStack_11cc = fStack_f8c;
                local_11c8._4_4_ = auVar74._0_4_;
                local_11c8._0_4_ = auVar156._0_4_;
                local_11c8._8_4_ = auVar74._4_4_;
                local_11c8._12_4_ = fVar122;
                local_1188 = auVar138;
                local_1158 = auVar145;
                local_1118._8_8_ = uStack_fe0;
                local_1118._0_8_ = local_fe8;
                pSVar33 = pRVar35->scene;
                _local_12e8 = auVar138;
                auVar125 = rcpps(auVar95,local_11c8);
                fVar129 = auVar125._0_4_;
                fVar78 = auVar125._4_4_;
                fVar79 = auVar125._8_4_;
                fVar80 = auVar125._12_4_;
                auVar74._12_4_ = (float)DAT_01f7ba10;
                fVar66 = DAT_01f7ba10._4_4_;
                fVar67 = DAT_01f7ba10._12_4_;
                auVar74._8_4_ = DAT_01f7ba10._8_4_;
                auVar156._0_4_ =
                     (float)(-(uint)(1e-18 <= ABS(auVar156._0_4_)) &
                            (uint)((auVar74._12_4_ - auVar156._0_4_ * fVar129) * fVar129 + fVar129))
                ;
                auVar74._0_4_ =
                     (float)(-(uint)(1e-18 <= ABS(auVar74._0_4_)) &
                            (uint)((fVar66 - auVar74._0_4_ * fVar78) * fVar78 + fVar78));
                auVar74._4_4_ =
                     (float)(-(uint)(1e-18 <= ABS(auVar74._4_4_)) &
                            (uint)((auVar74._8_4_ - auVar74._4_4_ * fVar79) * fVar79 + fVar79));
                fVar122 = (float)(-(uint)(1e-18 <= ABS(fVar122)) &
                                 (uint)((fVar67 - fVar122 * fVar80) * fVar80 + fVar80));
                auVar100._0_4_ = fVar123 * auVar156._0_4_;
                auVar100._4_4_ = fVar131 * auVar74._0_4_;
                auVar100._8_4_ = local_fa8._8_4_ * auVar74._4_4_;
                auVar100._12_4_ = local_fa8._12_4_ * fVar122;
                auVar125 = minps(auVar100,_DAT_01f7ba10);
                auVar155._0_4_ = auVar156._0_4_ * local_f98;
                auVar155._4_4_ = auVar74._0_4_ * fStack_f94;
                auVar155._8_4_ = auVar74._4_4_ * fStack_f90;
                auVar155._12_4_ = fVar122 * fStack_f8c;
                auVar156 = minps(auVar155,_DAT_01f7ba10);
                auVar73._0_4_ = auVar74._12_4_ - auVar125._0_4_;
                auVar73._4_4_ = fVar66 - auVar125._4_4_;
                auVar73._8_4_ = auVar74._8_4_ - auVar125._8_4_;
                auVar73._12_4_ = fVar67 - auVar125._12_4_;
                auVar84._0_4_ = auVar74._12_4_ - auVar156._0_4_;
                auVar84._4_4_ = fVar66 - auVar156._4_4_;
                auVar84._8_4_ = auVar74._8_4_ - auVar156._8_4_;
                auVar84._12_4_ = fVar67 - auVar156._12_4_;
                local_1178 = blendvps(auVar125,auVar73,local_1118);
                local_1168 = blendvps(auVar156,auVar84,local_1118);
                local_1148 = local_11b8;
                local_1138 = local_11a8;
                local_1128 = local_1198;
                auVar55._8_4_ = auVar138._8_4_;
                auVar55._0_8_ = auVar138._0_8_;
                auVar55._12_4_ = auVar138._12_4_;
                auVar74 = blendvps(_DAT_01f7a9f0,auVar145,auVar55);
                auVar85._4_4_ = auVar74._0_4_;
                auVar85._0_4_ = auVar74._4_4_;
                auVar85._8_4_ = auVar74._12_4_;
                auVar85._12_4_ = auVar74._8_4_;
                auVar156 = minps(auVar85,auVar74);
                auVar56._0_8_ = auVar156._8_8_;
                auVar56._8_4_ = auVar156._0_4_;
                auVar56._12_4_ = auVar156._4_4_;
                auVar156 = minps(auVar56,auVar156);
                auVar57._0_8_ =
                     CONCAT44(-(uint)(auVar156._4_4_ == auVar74._4_4_) & uVar141,
                              -(uint)(auVar156._0_4_ == auVar74._0_4_) & uVar136);
                auVar57._8_4_ = -(uint)(auVar156._8_4_ == auVar74._8_4_) & auVar138._8_4_;
                auVar57._12_4_ = -(uint)(auVar156._12_4_ == auVar74._12_4_) & auVar138._12_4_;
                iVar19 = movmskps(uVar28,auVar57);
                if (iVar19 != 0) {
                  auVar138._8_4_ = auVar57._8_4_;
                  auVar138._0_8_ = auVar57._0_8_;
                  auVar138._12_4_ = auVar57._12_4_;
                }
                uVar39 = extractps(auVar8,1);
                uVar20 = movmskps(iVar19,auVar138);
                pRVar40 = (RayHit *)0x0;
                auVar156._0_4_ = (float)auVar8._0_4_;
                if (CONCAT44(uVar24,uVar20) != 0) {
                  for (; (CONCAT44(uVar24,uVar20) >> (long)pRVar40 & 1) == 0;
                      pRVar40 = (RayHit *)((long)(pRVar40->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
LAB_00d9b1e1:
                uVar37 = local_1238;
                lVar32 = local_1298;
                uVar28 = *(uint *)(local_1298 + 0xc0 + (long)pRVar40 * 4);
                pRVar23 = (RayHit *)(ulong)uVar28;
                context = (RayQueryContext *)(pSVar33->geometries).items[(long)pRVar23].ptr;
                uVar136 = (uint)uVar39;
                if ((((Geometry *)context)->mask & uVar136) == 0) {
                  *(undefined4 *)(local_12e8 + (long)pRVar40 * 4) = 0;
                  uVar37 = local_1238;
                  goto LAB_00d9b24e;
                }
                _local_1308 = pRVar35->args;
                if (pRVar35->args->filter == (RTCFilterFunctionN)0x0) {
                  pRVar27 = pRVar35->user;
                  if (((Geometry *)context)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    auVar156._0_4_ = *(float *)(local_1178 + (long)pRVar40 * 4);
                    auVar74._0_4_ = *(float *)(local_1168 + (long)pRVar40 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1158 + (long)pRVar40 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1148 + (long)pRVar40 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1138 + (long)pRVar40 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1128 + (long)pRVar40 * 4);
                    ray->u = auVar156._0_4_;
                    ray->v = auVar74._0_4_;
                    uVar136 = *(uint *)((long)&local_11f8 + (long)pRVar40 * 4);
                    context = (RayQueryContext *)(ulong)uVar136;
                    ray->primID = uVar136;
                    ray->geomID = uVar28;
                    ray->instID[0] = pRVar27->instID[0];
                    uVar28 = pRVar27->instPrimID[0];
                    uVar24 = 0;
                    ray->instPrimID[0] = uVar28;
LAB_00d9b57d:
                    local_1208 = *(float *)(lVar32 + 0x30);
                    fStack_1204 = *(float *)(lVar32 + 0x34);
                    fStack_1200 = *(float *)(lVar32 + 0x38);
                    fStack_11fc = *(float *)(lVar32 + 0x3c);
                    local_1228 = *(float *)(lVar32 + 0x40);
                    fStack_1224 = *(float *)(lVar32 + 0x44);
                    fStack_1220 = *(float *)(lVar32 + 0x48);
                    fStack_121c = *(float *)(lVar32 + 0x4c);
                    local_1218 = *(float *)(lVar32 + 0x50);
                    fStack_1214 = *(float *)(lVar32 + 0x54);
                    fStack_1210 = *(float *)(lVar32 + 0x58);
                    fStack_120c = *(float *)(lVar32 + 0x5c);
                    unique0x100020cf = *(long *)(lVar32 + 0x90);
                    auStack_1310 = *(undefined1 (*) [8])(lVar32 + 0x98);
                    _local_1308 = *(undefined8 *)(lVar32 + 0xa0);
                    _fStack_1300 = *(undefined8 *)(lVar32 + 0xa8);
                    local_1348 = *(float *)(lVar32 + 0xb0);
                    fStack_1344 = *(float *)(lVar32 + 0xb4);
                    fStack_1340 = *(float *)(lVar32 + 0xb8);
                    fStack_133c = *(float *)(lVar32 + 0xbc);
                    uVar39 = local_1230;
                    goto LAB_00d9b5b3;
                  }
                  stack0xffffffffffffece8 = context;
                }
                else {
                  stack0xffffffffffffece8 = context;
                  pRVar27 = pRVar35->user;
                }
                local_1288 = *(float *)(local_1148 + (long)pRVar40 * 4);
                local_1284 = *(undefined4 *)(local_1138 + (long)pRVar40 * 4);
                local_1280 = *(undefined4 *)(local_1128 + (long)pRVar40 * 4);
                local_127c = *(undefined4 *)(local_1178 + (long)pRVar40 * 4);
                local_1278 = *(undefined4 *)(local_1168 + (long)pRVar40 * 4);
                local_1274 = *(undefined4 *)((long)&local_11f8 + (long)pRVar40 * 4);
                local_1270 = uVar28;
                local_126c = pRVar27->instID[0];
                local_1268 = pRVar27->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_1158 + (long)pRVar40 * 4);
                local_131c._0_4_ = -NAN;
                local_12c8.valid = (int *)local_131c;
                local_12c8.geometryUserPtr = ((Geometry *)context)->userPtr;
                local_12c8.context = pRVar27;
                local_12c8.ray = (RTCRayN *)ray;
                local_12c8.hit = (RTCHitN *)&local_1288;
                local_12c8.N = 1;
                unique0x1000398f = context;
                local_12d8 = pSVar33;
                if (((((Geometry *)context)->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*((Geometry *)context)->intersectionFilterN)(&local_12c8),
                    context = (RayQueryContext *)extraout_RDX, ray = local_12f8,
                    pRVar35 = local_12f0,
                    (((RayK<1> *)local_12c8.valid)->org).field_0.m128[0] != 0.0)) &&
                   ((*(RTCFilterFunctionN *)(_local_1308 + 0x10) == (RTCFilterFunctionN)0x0 ||
                    ((((*(byte *)_local_1308 & 2) == 0 &&
                      ((*(byte *)(stack0xffffffffffffece8 + 0x3e) & 0x40) == 0)) ||
                     ((**(RTCFilterFunctionN *)(_local_1308 + 0x10))(&local_12c8),
                     context = (RayQueryContext *)extraout_RDX_00, ray = local_12f8,
                     pRVar35 = local_12f0,
                     (((RayK<1> *)local_12c8.valid)->org).field_0.m128[0] != 0.0)))))) {
                  (((Vec3f *)((long)local_12c8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_12c8.hit;
                  (((Vec3f *)((long)local_12c8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_12c8.hit + 4);
                  (((Vec3f *)((long)local_12c8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_12c8.hit + 8);
                  *(float *)((long)local_12c8.ray + 0x3c) = *(float *)(local_12c8.hit + 0xc);
                  *(float *)((long)local_12c8.ray + 0x40) = *(float *)(local_12c8.hit + 0x10);
                  *(float *)((long)local_12c8.ray + 0x44) = *(float *)(local_12c8.hit + 0x14);
                  *(float *)((long)local_12c8.ray + 0x48) = *(float *)(local_12c8.hit + 0x18);
                  context = (RayQueryContext *)(ulong)(uint)*(float *)(local_12c8.hit + 0x1c);
                  *(float *)((long)local_12c8.ray + 0x4c) = *(float *)(local_12c8.hit + 0x1c);
                  *(float *)((long)local_12c8.ray + 0x50) = *(float *)(local_12c8.hit + 0x20);
                  pRVar23 = (RayHit *)local_12c8.ray;
                }
                else {
                  (local_12f8->super_RayK<1>).tfar = auVar156._0_4_;
                  pRVar23 = (RayHit *)local_12c8.valid;
                  ray = local_12f8;
                  pRVar35 = local_12f0;
                }
                lVar32 = local_1298;
                pSVar33 = local_12d8;
                *(undefined4 *)(local_12e8 + (long)pRVar40 * 4) = 0;
                auVar156._0_4_ = (ray->super_RayK<1>).tfar;
                auVar156._4_4_ = (ray->super_RayK<1>).mask;
                auVar156._8_4_ = (ray->super_RayK<1>).id;
                auVar156._12_4_ = (ray->super_RayK<1>).flags;
                local_12e8._0_4_ = -(uint)(auVar145._0_4_ <= auVar156._0_4_) & local_12e8._0_4_;
                local_12e8._4_4_ = -(uint)(auVar145._4_4_ <= auVar156._0_4_) & local_12e8._4_4_;
                local_12e8._8_4_ = -(uint)(auVar145._8_4_ <= auVar156._0_4_) & local_12e8._8_4_;
                fStack_12dc = (float)(-(uint)(auVar145._12_4_ <= auVar156._0_4_) & (uint)fStack_12dc
                                     );
                uVar26 = extractps(auVar156,1);
                uVar136 = (uint)uVar26;
LAB_00d9b24e:
                uVar24 = (undefined4)((ulong)pRVar23 >> 0x20);
                uVar28 = movmskps((int)pRVar23,_local_12e8);
                if (uVar28 == 0) goto LAB_00d9b57d;
                uVar39 = (ulong)uVar136;
                BVHNIntersector1<4,1,true,embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,true>>>
                ::intersect();
                ray = local_12f8;
                pRVar35 = local_12f0;
                pRVar40 = (RayHit *)local_12c8.valid;
                goto LAB_00d9b1e1;
              }
            }
LAB_00d9b5b3:
            auVar156._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
            auVar74._0_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
            auVar74._4_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar116 = *(float *)(lVar32 + 0x60) - auVar156._0_4_;
            fVar117 = *(float *)(lVar32 + 100) - auVar156._0_4_;
            auStack_12d0[0] = (uint)(*(float *)(lVar32 + 0x68) - auVar156._0_4_);
            auStack_12cc[0] = (uint)(*(float *)(lVar32 + 0x6c) - auVar156._0_4_);
            fVar78 = *(float *)(lVar32 + 0x70) - auVar74._0_4_;
            fVar79 = *(float *)(lVar32 + 0x74) - auVar74._0_4_;
            fVar80 = *(float *)(lVar32 + 0x78) - auVar74._0_4_;
            fVar88 = *(float *)(lVar32 + 0x7c) - auVar74._0_4_;
            fVar110 = *(float *)(lVar32 + 0x80) - auVar74._4_4_;
            fVar111 = *(float *)(lVar32 + 0x84) - auVar74._4_4_;
            fVar112 = *(float *)(lVar32 + 0x88) - auVar74._4_4_;
            fVar113 = *(float *)(lVar32 + 0x8c) - auVar74._4_4_;
            fVar129 = (float)local_131c._4_4_ - auVar156._0_4_;
            fVar90 = fStack_1314 - auVar156._0_4_;
            fVar106 = (float)auStack_1310._0_4_ - auVar156._0_4_;
            fVar109 = (float)auStack_1310._4_4_ - auVar156._0_4_;
            fVar134 = local_1308 - auVar74._0_4_;
            fVar147 = fStack_1304 - auVar74._0_4_;
            fVar140 = fStack_1300 - auVar74._0_4_;
            fVar153 = fStack_12fc - auVar74._0_4_;
            local_1348 = local_1348 - auVar74._4_4_;
            fStack_1344 = fStack_1344 - auVar74._4_4_;
            fStack_1340 = fStack_1340 - auVar74._4_4_;
            fStack_133c = fStack_133c - auVar74._4_4_;
            fVar132 = local_1208 - auVar156._0_4_;
            fVar118 = fStack_1204 - auVar156._0_4_;
            fVar119 = fStack_1200 - auVar156._0_4_;
            auVar156._0_4_ = fStack_11fc - auVar156._0_4_;
            fVar130 = local_1228 - auVar74._0_4_;
            fVar131 = fStack_1224 - auVar74._0_4_;
            fVar133 = fStack_1220 - auVar74._0_4_;
            auVar74._0_4_ = fStack_121c - auVar74._0_4_;
            fVar120 = local_1218 - auVar74._4_4_;
            fVar142 = fStack_1214 - auVar74._4_4_;
            fVar123 = fStack_1210 - auVar74._4_4_;
            auVar74._4_4_ = fStack_120c - auVar74._4_4_;
            local_1228 = fVar132 - fVar116;
            fStack_1224 = fVar118 - fVar117;
            fStack_1220 = fVar119 - (float)auStack_12d0[0];
            fStack_121c = auVar156._0_4_ - (float)auStack_12cc[0];
            local_10b8 = fVar130 - fVar78;
            fStack_10b4 = fVar131 - fVar79;
            fStack_10b0 = fVar133 - fVar80;
            fStack_10ac = auVar74._0_4_ - fVar88;
            local_1258 = fVar120 - fVar110;
            fStack_1254 = fVar142 - fVar111;
            fStack_1250 = fVar123 - fVar112;
            fStack_124c = auVar74._4_4_ - fVar113;
            auVar74._8_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_1304 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1314 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar89 = (local_10b8 * (fVar110 + fVar120) - (fVar78 + fVar130) * local_1258) *
                     auVar74._8_4_ +
                     ((fVar116 + fVar132) * local_1258 - (fVar110 + fVar120) * local_1228) *
                     fStack_1304 +
                     (local_1228 * (fVar78 + fVar130) - (fVar116 + fVar132) * local_10b8) *
                     fStack_1314;
            fVar97 = (fStack_10b4 * (fVar111 + fVar142) - (fVar79 + fVar131) * fStack_1254) *
                     auVar74._8_4_ +
                     ((fVar117 + fVar118) * fStack_1254 - (fVar111 + fVar142) * fStack_1224) *
                     fStack_1304 +
                     (fStack_1224 * (fVar79 + fVar131) - (fVar117 + fVar118) * fStack_10b4) *
                     fStack_1314;
            local_11e8._0_8_ = CONCAT44(fVar97,fVar89);
            local_11e8._8_4_ =
                 (fStack_10b0 * (fVar112 + fVar123) - (fVar80 + fVar133) * fStack_1250) *
                 auVar74._8_4_ +
                 (((float)auStack_12d0[0] + fVar119) * fStack_1250 -
                 (fVar112 + fVar123) * fStack_1220) * fStack_1304 +
                 (fStack_1220 * (fVar80 + fVar133) -
                 ((float)auStack_12d0[0] + fVar119) * fStack_10b0) * fStack_1314;
            fStack_11dc = (fStack_10ac * (fVar113 + auVar74._4_4_) -
                          (fVar88 + auVar74._0_4_) * fStack_124c) * auVar74._8_4_ +
                          (((float)auStack_12cc[0] + auVar156._0_4_) * fStack_124c -
                          (fVar113 + auVar74._4_4_) * fStack_121c) * fStack_1304 +
                          (fStack_121c * (fVar88 + auVar74._0_4_) -
                          ((float)auStack_12cc[0] + auVar156._0_4_) * fStack_10ac) * fStack_1314;
            auVar74._12_4_ = fVar116 - fVar129;
            fVar122 = fVar117 - fVar90;
            fVar66 = (float)auStack_12d0[0] - fVar106;
            fVar67 = (float)auStack_12cc[0] - fVar109;
            local_10c8 = fVar78 - fVar134;
            fStack_10c4 = fVar79 - fVar147;
            fStack_10c0 = fVar80 - fVar140;
            fStack_10bc = fVar88 - fVar153;
            fVar143 = fVar110 - local_1348;
            fVar148 = fVar111 - fStack_1344;
            fVar150 = fVar112 - fStack_1340;
            fVar154 = fVar113 - fStack_133c;
            local_1208 = fVar78;
            fStack_1204 = fVar79;
            fStack_1200 = fVar80;
            fStack_11fc = fVar88;
            local_1218 = fVar110;
            fStack_1214 = fVar111;
            fStack_1210 = fVar112;
            fStack_120c = fVar113;
            local_12d8 = (Scene *)CONCAT44(fVar117,fVar116);
            local_10d8._0_4_ =
                 (local_10c8 * (fVar110 + local_1348) - (fVar78 + fVar134) * fVar143) *
                 auVar74._8_4_ +
                 ((fVar116 + fVar129) * fVar143 - (fVar110 + local_1348) * auVar74._12_4_) *
                 fStack_1304 +
                 (auVar74._12_4_ * (fVar78 + fVar134) - (fVar116 + fVar129) * local_10c8) *
                 fStack_1314;
            local_10d8._4_4_ =
                 (fStack_10c4 * (fVar111 + fStack_1344) - (fVar79 + fVar147) * fVar148) *
                 auVar74._8_4_ +
                 ((fVar117 + fVar90) * fVar148 - (fVar111 + fStack_1344) * fVar122) * fStack_1304 +
                 (fVar122 * (fVar79 + fVar147) - (fVar117 + fVar90) * fStack_10c4) * fStack_1314;
            fStack_10d0 = (fStack_10c0 * (fVar112 + fStack_1340) - (fVar80 + fVar140) * fVar150) *
                          auVar74._8_4_ +
                          (((float)auStack_12d0[0] + fVar106) * fVar150 -
                          (fVar112 + fStack_1340) * fVar66) * fStack_1304 +
                          (fVar66 * (fVar80 + fVar140) -
                          ((float)auStack_12d0[0] + fVar106) * fStack_10c0) * fStack_1314;
            fStack_10cc = (fStack_10bc * (fVar113 + fStack_133c) - (fVar88 + fVar153) * fVar154) *
                          auVar74._8_4_ +
                          (((float)auStack_12cc[0] + fVar109) * fVar154 -
                          (fVar113 + fStack_133c) * fVar67) * fStack_1304 +
                          (fVar67 * (fVar88 + fVar153) -
                          ((float)auStack_12cc[0] + fVar109) * fStack_10bc) * fStack_1314;
            local_1108 = fVar129 - fVar132;
            fStack_1104 = fVar90 - fVar118;
            fStack_1100 = fVar106 - fVar119;
            fStack_10fc = fVar109 - auVar156._0_4_;
            local_10f8 = fVar134 - fVar130;
            fStack_10f4 = fVar147 - fVar131;
            fStack_10f0 = fVar140 - fVar133;
            fStack_10ec = fVar153 - auVar74._0_4_;
            fVar135 = local_1348 - fVar120;
            fVar149 = fStack_1344 - fVar142;
            fVar152 = fStack_1340 - fVar123;
            fVar158 = fStack_133c - auVar74._4_4_;
            local_131c._4_4_ = fStack_1314;
            auStack_1310._4_4_ = fStack_1314;
            auStack_1310._0_4_ = fStack_1314;
            local_1308 = fStack_1304;
            fStack_12fc = fStack_1304;
            fStack_1300 = fStack_1304;
            auVar58._0_4_ =
                 (local_10f8 * (fVar120 + local_1348) - (fVar130 + fVar134) * fVar135) *
                 auVar74._8_4_ +
                 ((fVar132 + fVar129) * fVar135 - (fVar120 + local_1348) * local_1108) * fStack_1304
                 + (local_1108 * (fVar130 + fVar134) - (fVar132 + fVar129) * local_10f8) *
                   fStack_1314;
            auVar58._4_4_ =
                 (fStack_10f4 * (fVar142 + fStack_1344) - (fVar131 + fVar147) * fVar149) *
                 auVar74._8_4_ +
                 ((fVar118 + fVar90) * fVar149 - (fVar142 + fStack_1344) * fStack_1104) *
                 fStack_1304 +
                 (fStack_1104 * (fVar131 + fVar147) - (fVar118 + fVar90) * fStack_10f4) *
                 fStack_1314;
            auVar58._8_4_ =
                 (fStack_10f0 * (fVar123 + fStack_1340) - (fVar133 + fVar140) * fVar152) *
                 auVar74._8_4_ +
                 ((fVar119 + fVar106) * fVar152 - (fVar123 + fStack_1340) * fStack_1100) *
                 fStack_1304 +
                 (fStack_1100 * (fVar133 + fVar140) - (fVar119 + fVar106) * fStack_10f0) *
                 fStack_1314;
            auVar58._12_4_ =
                 (fStack_10ec * (auVar74._4_4_ + fStack_133c) - (auVar74._0_4_ + fVar153) * fVar158)
                 * auVar74._8_4_ +
                 ((auVar156._0_4_ + fVar109) * fVar158 - (auVar74._4_4_ + fStack_133c) * fStack_10fc
                 ) * fStack_1304 +
                 (fStack_10fc * (auVar74._0_4_ + fVar153) - (auVar156._0_4_ + fVar109) * fStack_10ec
                 ) * fStack_1314;
            local_10e8 = (float)local_10d8._0_4_ + fVar89 + auVar58._0_4_;
            fStack_10e4 = (float)local_10d8._4_4_ + fVar97 + auVar58._4_4_;
            fStack_10e0 = fStack_10d0 + (float)local_11e8._8_4_ + auVar58._8_4_;
            fStack_10dc = fStack_10cc + fStack_11dc + auVar58._12_4_;
            auVar75._8_4_ = local_11e8._8_4_;
            auVar75._0_8_ = local_11e8._0_8_;
            auVar75._12_4_ = fStack_11dc;
            auVar156 = minps(auVar75,_local_10d8);
            auVar125 = minps(auVar156,auVar58);
            auVar127._8_4_ = local_11e8._8_4_;
            auVar127._0_8_ = local_11e8._0_8_;
            auVar127._12_4_ = fStack_11dc;
            auVar156 = maxps(auVar127,_local_10d8);
            auVar124 = maxps(auVar156,auVar58);
            auVar156._0_4_ = ABS(local_10e8) * 1.1920929e-07;
            auVar74._0_4_ = ABS(fStack_10e4) * 1.1920929e-07;
            auVar74._4_4_ = ABS(fStack_10e0) * 1.1920929e-07;
            fVar129 = ABS(fStack_10dc) * 1.1920929e-07;
            auVar128._4_4_ = -(uint)(auVar124._4_4_ <= auVar74._0_4_);
            auVar128._0_4_ = -(uint)(auVar124._0_4_ <= auVar156._0_4_);
            auVar128._8_4_ = -(uint)(auVar124._8_4_ <= auVar74._4_4_);
            auVar128._12_4_ = -(uint)(auVar124._12_4_ <= fVar129);
            auVar76._4_4_ = -(uint)(-auVar74._0_4_ <= auVar125._4_4_);
            auVar76._0_4_ = -(uint)(-auVar156._0_4_ <= auVar125._0_4_);
            auVar76._8_4_ = -(uint)(-auVar74._4_4_ <= auVar125._8_4_);
            auVar76._12_4_ = -(uint)(-fVar129 <= auVar125._12_4_);
            auVar128 = auVar128 | auVar76;
            iVar19 = movmskps(uVar28,auVar128);
            if (iVar19 != 0) {
              auVar115._0_4_ = local_10b8 * fVar143 - local_10c8 * local_1258;
              auVar115._4_4_ = fStack_10b4 * fVar148 - fStack_10c4 * fStack_1254;
              auVar115._8_4_ = fStack_10b0 * fVar150 - fStack_10c0 * fStack_1250;
              auVar115._12_4_ = fStack_10ac * fVar154 - fStack_10bc * fStack_124c;
              auVar68._0_4_ = local_10c8 * fVar135 - fVar143 * local_10f8;
              auVar68._4_4_ = fStack_10c4 * fVar149 - fVar148 * fStack_10f4;
              auVar68._8_4_ = fStack_10c0 * fVar152 - fVar150 * fStack_10f0;
              auVar68._12_4_ = fStack_10bc * fVar158 - fVar154 * fStack_10ec;
              auVar59._4_4_ = -(uint)(ABS(fStack_10c4 * fStack_1254) < ABS(fVar148 * fStack_10f4));
              auVar59._0_4_ = -(uint)(ABS(local_10c8 * local_1258) < ABS(fVar143 * local_10f8));
              auVar59._8_4_ = -(uint)(ABS(fStack_10c0 * fStack_1250) < ABS(fVar150 * fStack_10f0));
              auVar59._12_4_ = -(uint)(ABS(fStack_10bc * fStack_124c) < ABS(fVar154 * fStack_10ec));
              local_11b8 = blendvps(auVar68,auVar115,auVar59);
              auVar96._0_4_ = local_1258 * auVar74._12_4_ - fVar143 * local_1228;
              auVar96._4_4_ = fStack_1254 * fVar122 - fVar148 * fStack_1224;
              auVar96._8_4_ = fStack_1250 * fVar66 - fVar150 * fStack_1220;
              auVar96._12_4_ = fStack_124c * fVar67 - fVar154 * fStack_121c;
              auVar139._0_4_ = fVar143 * local_1108 - auVar74._12_4_ * fVar135;
              auVar139._4_4_ = fVar148 * fStack_1104 - fVar122 * fVar149;
              auVar139._8_4_ = fVar150 * fStack_1100 - fVar66 * fVar152;
              auVar139._12_4_ = fVar154 * fStack_10fc - fVar67 * fVar158;
              auVar60._4_4_ = -(uint)(ABS(fVar148 * fStack_1224) < ABS(fVar122 * fVar149));
              auVar60._0_4_ = -(uint)(ABS(fVar143 * local_1228) < ABS(auVar74._12_4_ * fVar135));
              auVar60._8_4_ = -(uint)(ABS(fVar150 * fStack_1220) < ABS(fVar66 * fVar152));
              auVar60._12_4_ = -(uint)(ABS(fVar154 * fStack_121c) < ABS(fVar67 * fVar158));
              local_11a8 = blendvps(auVar139,auVar96,auVar60);
              auVar157._0_4_ = local_1228 * local_10c8 - auVar74._12_4_ * local_10b8;
              auVar157._4_4_ = fStack_1224 * fStack_10c4 - fVar122 * fStack_10b4;
              auVar157._8_4_ = fStack_1220 * fStack_10c0 - fVar66 * fStack_10b0;
              auVar157._12_4_ = fStack_121c * fStack_10bc - fVar67 * fStack_10ac;
              auVar146._0_4_ = auVar74._12_4_ * local_10f8 - local_10c8 * local_1108;
              auVar146._4_4_ = fVar122 * fStack_10f4 - fStack_10c4 * fStack_1104;
              auVar146._8_4_ = fVar66 * fStack_10f0 - fStack_10c0 * fStack_1100;
              auVar146._12_4_ = fVar67 * fStack_10ec - fStack_10bc * fStack_10fc;
              auVar61._4_4_ = -(uint)(ABS(fVar122 * fStack_10b4) < ABS(fStack_10c4 * fStack_1104));
              auVar61._0_4_ =
                   -(uint)(ABS(auVar74._12_4_ * local_10b8) < ABS(local_10c8 * local_1108));
              auVar61._8_4_ = -(uint)(ABS(fVar66 * fStack_10b0) < ABS(fStack_10c0 * fStack_1100));
              auVar61._12_4_ = -(uint)(ABS(fVar67 * fStack_10ac) < ABS(fStack_10bc * fStack_10fc));
              local_1198 = blendvps(auVar146,auVar157,auVar61);
              local_11c8._4_4_ = fStack_10e4;
              local_11c8._0_4_ = local_10e8;
              local_11c8._8_4_ = fStack_10e0;
              local_11c8._12_4_ = fStack_10dc;
              auVar74._12_4_ =
                   auVar74._8_4_ * local_11b8._0_4_ +
                   fStack_1304 * local_11a8._0_4_ + fStack_1314 * local_1198._0_4_;
              fVar122 = auVar74._8_4_ * local_11b8._4_4_ +
                        fStack_1304 * local_11a8._4_4_ + fStack_1314 * local_1198._4_4_;
              fVar66 = auVar74._8_4_ * local_11b8._8_4_ +
                       fStack_1304 * local_11a8._8_4_ + fStack_1314 * local_1198._8_4_;
              fVar67 = auVar74._8_4_ * local_11b8._12_4_ +
                       fStack_1304 * local_11a8._12_4_ + fStack_1314 * local_1198._12_4_;
              auVar74._12_4_ = auVar74._12_4_ + auVar74._12_4_;
              fVar122 = fVar122 + fVar122;
              fVar66 = fVar66 + fVar66;
              fVar67 = fVar67 + fVar67;
              auVar62._0_4_ = fVar78 * local_11a8._0_4_ + fVar110 * local_1198._0_4_;
              auVar62._4_4_ = fVar79 * local_11a8._4_4_ + fVar111 * local_1198._4_4_;
              auVar62._8_4_ = fVar80 * local_11a8._8_4_ + fVar112 * local_1198._8_4_;
              auVar62._12_4_ = fVar88 * local_11a8._12_4_ + fVar113 * local_1198._12_4_;
              auVar156._0_4_ = fVar116 * local_11b8._0_4_ + auVar62._0_4_;
              auVar74._0_4_ = fVar117 * local_11b8._4_4_ + auVar62._4_4_;
              auVar74._4_4_ = (float)auStack_12d0[0] * local_11b8._8_4_ + auVar62._8_4_;
              auVar74._8_4_ = (float)auStack_12cc[0] * local_11b8._12_4_ + auVar62._12_4_;
              auVar105._0_4_ = auVar156._0_4_ + auVar156._0_4_;
              auVar105._4_4_ = auVar74._0_4_ + auVar74._0_4_;
              auVar105._8_4_ = auVar74._4_4_ + auVar74._4_4_;
              auVar105._12_4_ = auVar74._8_4_ + auVar74._8_4_;
              auVar14._4_4_ = fVar122;
              auVar14._0_4_ = auVar74._12_4_;
              auVar14._8_4_ = fVar66;
              auVar14._12_4_ = fVar67;
              auVar156 = rcpps(auVar62,auVar14);
              auVar74._0_4_ = auVar156._4_4_;
              auVar74._4_4_ = auVar156._8_4_;
              auVar74._8_4_ = auVar156._12_4_;
              auVar108._0_4_ =
                   ((1.0 - auVar74._12_4_ * auVar156._0_4_) * auVar156._0_4_ + auVar156._0_4_) *
                   auVar105._0_4_;
              auVar108._4_4_ =
                   ((1.0 - fVar122 * auVar74._0_4_) * auVar74._0_4_ + auVar74._0_4_) *
                   auVar105._4_4_;
              auVar108._8_4_ =
                   ((1.0 - fVar66 * auVar74._4_4_) * auVar74._4_4_ + auVar74._4_4_) * auVar105._8_4_
              ;
              auVar108._12_4_ =
                   ((1.0 - fVar67 * auVar74._8_4_) * auVar74._8_4_ + auVar74._8_4_) *
                   auVar105._12_4_;
              auVar9._0_4_ = (ray->super_RayK<1>).tfar;
              auVar9._4_4_ = (ray->super_RayK<1>).mask;
              auVar9._8_4_ = (ray->super_RayK<1>).id;
              auVar9._12_4_ = (ray->super_RayK<1>).flags;
              auVar156._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3];
              local_1188._0_4_ =
                   -(uint)(auVar74._12_4_ != 0.0) & auVar128._0_4_ &
                   -(uint)(auVar108._0_4_ <= (float)auVar9._0_4_ && auVar156._0_4_ <= auVar108._0_4_
                          );
              local_1188._4_4_ =
                   -(uint)(fVar122 != 0.0) & auVar128._4_4_ &
                   -(uint)(auVar108._4_4_ <= (float)auVar9._0_4_ && auVar156._0_4_ <= auVar108._4_4_
                          );
              local_1188._8_4_ =
                   -(uint)(fVar66 != 0.0) & auVar128._8_4_ &
                   -(uint)(auVar108._8_4_ <= (float)auVar9._0_4_ && auVar156._0_4_ <= auVar108._8_4_
                          );
              local_1188._12_4_ =
                   -(uint)(fVar67 != 0.0) & auVar128._12_4_ &
                   -(uint)(auVar108._12_4_ <= (float)auVar9._0_4_ &&
                          auVar156._0_4_ <= auVar108._12_4_);
              auVar15._4_4_ = local_1188._4_4_;
              auVar15._0_4_ = local_1188._0_4_;
              auVar15._8_4_ = local_1188._8_4_;
              auVar15._12_4_ = local_1188._12_4_;
              iVar19 = movmskps(iVar19,auVar15);
              if (iVar19 != 0) {
                _local_11d8 = _local_10d8;
                local_1158 = auVar108;
                local_1118._8_8_ = uStack_ff0;
                local_1118._0_8_ = local_ff8;
                pSVar33 = pRVar35->scene;
                local_12e8._4_4_ = local_1188._4_4_;
                local_12e8._0_4_ = local_1188._0_4_;
                local_12e8._8_4_ = local_1188._8_4_;
                fStack_12dc = (float)local_1188._12_4_;
                auVar156 = rcpps(auVar105,local_11c8);
                auVar74._12_4_ = auVar156._0_4_;
                fVar122 = auVar156._4_4_;
                fVar66 = auVar156._8_4_;
                fVar67 = auVar156._12_4_;
                auVar74._0_4_ = (float)DAT_01f7ba10;
                auVar74._4_4_ = DAT_01f7ba10._4_4_;
                auVar74._8_4_ = DAT_01f7ba10._12_4_;
                auVar156._0_4_ = DAT_01f7ba10._8_4_;
                auVar74._12_4_ =
                     (float)(-(uint)(1e-18 <= ABS(local_10e8)) &
                            (uint)((auVar74._0_4_ - local_10e8 * auVar74._12_4_) * auVar74._12_4_ +
                                  auVar74._12_4_));
                fVar122 = (float)(-(uint)(1e-18 <= ABS(fStack_10e4)) &
                                 (uint)((auVar74._4_4_ - fStack_10e4 * fVar122) * fVar122 + fVar122)
                                 );
                fVar66 = (float)(-(uint)(1e-18 <= ABS(fStack_10e0)) &
                                (uint)((auVar156._0_4_ - fStack_10e0 * fVar66) * fVar66 + fVar66));
                fVar67 = (float)(-(uint)(1e-18 <= ABS(fStack_10dc)) &
                                (uint)((auVar74._8_4_ - fStack_10dc * fVar67) * fVar67 + fVar67));
                auVar101._0_4_ = fVar89 * auVar74._12_4_;
                auVar101._4_4_ = fVar97 * fVar122;
                auVar101._8_4_ = (float)local_11e8._8_4_ * fVar66;
                auVar101._12_4_ = fStack_11dc * fVar67;
                auVar125 = minps(auVar101,_DAT_01f7ba10);
                auVar151._0_4_ = auVar74._12_4_ * (float)local_10d8._0_4_;
                auVar151._4_4_ = fVar122 * (float)local_10d8._4_4_;
                auVar151._8_4_ = fVar66 * fStack_10d0;
                auVar151._12_4_ = fVar67 * fStack_10cc;
                auVar124 = minps(auVar151,_DAT_01f7ba10);
                auVar77._0_4_ = auVar74._0_4_ - auVar125._0_4_;
                auVar77._4_4_ = auVar74._4_4_ - auVar125._4_4_;
                auVar77._8_4_ = auVar156._0_4_ - auVar125._8_4_;
                auVar77._12_4_ = auVar74._8_4_ - auVar125._12_4_;
                auVar86._0_4_ = auVar74._0_4_ - auVar124._0_4_;
                auVar86._4_4_ = auVar74._4_4_ - auVar124._4_4_;
                auVar86._8_4_ = auVar156._0_4_ - auVar124._8_4_;
                auVar86._12_4_ = auVar74._8_4_ - auVar124._12_4_;
                local_1178 = blendvps(auVar125,auVar77,local_1118);
                local_1168 = blendvps(auVar124,auVar86,local_1118);
                local_1148 = local_11b8;
                local_1138 = local_11a8;
                local_1128 = local_1198;
                auVar63._4_4_ = local_1188._4_4_;
                auVar63._0_4_ = local_1188._0_4_;
                auVar63._8_4_ = local_1188._8_4_;
                auVar63._12_4_ = local_1188._12_4_;
                auVar74 = blendvps(_DAT_01f7a9f0,auVar108,auVar63);
                auVar87._4_4_ = auVar74._0_4_;
                auVar87._0_4_ = auVar74._4_4_;
                auVar87._8_4_ = auVar74._12_4_;
                auVar87._12_4_ = auVar74._8_4_;
                auVar156 = minps(auVar87,auVar74);
                auVar64._0_8_ = auVar156._8_8_;
                auVar64._8_4_ = auVar156._0_4_;
                auVar64._12_4_ = auVar156._4_4_;
                auVar156 = minps(auVar64,auVar156);
                auVar65._0_4_ = -(uint)(auVar156._0_4_ == auVar74._0_4_) & local_1188._0_4_;
                auVar65._4_4_ = -(uint)(auVar156._4_4_ == auVar74._4_4_) & local_1188._4_4_;
                auVar65._8_4_ = -(uint)(auVar156._8_4_ == auVar74._8_4_) & local_1188._8_4_;
                auVar65._12_4_ = -(uint)(auVar156._12_4_ == auVar74._12_4_) & local_1188._12_4_;
                iVar19 = movmskps(iVar19,auVar65);
                uVar28 = local_1188._0_4_;
                uVar136 = local_1188._4_4_;
                uVar141 = local_1188._8_4_;
                uVar121 = local_1188._12_4_;
                if (iVar19 != 0) {
                  uVar28 = auVar65._0_4_;
                  uVar136 = auVar65._4_4_;
                  uVar141 = auVar65._8_4_;
                  uVar121 = auVar65._12_4_;
                }
                uVar39 = extractps(auVar9,1);
                auVar16._4_4_ = uVar136;
                auVar16._0_4_ = uVar28;
                auVar16._8_4_ = uVar141;
                auVar16._12_4_ = uVar121;
                uVar20 = movmskps(iVar19,auVar16);
                pRVar40 = (RayHit *)0x0;
                auVar74._0_4_ = (float)auVar9._0_4_;
                auVar74._4_4_ = (float)auVar9._4_4_;
                auVar74._8_4_ = (float)auVar9._8_4_;
                auVar74._12_4_ = (float)auVar9._12_4_;
                if (CONCAT44(uVar24,uVar20) != 0) {
                  for (; (CONCAT44(uVar24,uVar20) >> (long)pRVar40 & 1) == 0;
                      pRVar40 = (RayHit *)((long)(pRVar40->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar38 = local_1240;
                  uVar28 = *(uint *)(lVar32 + 0xc0 + (long)pRVar40 * 4);
                  context = (RayQueryContext *)(pSVar33->geometries).items[uVar28].ptr;
                  uVar136 = (uint)uVar39;
                  if ((((Geometry *)context)->mask & uVar136) == 0) {
                    *(undefined4 *)(local_12e8 + (long)pRVar40 * 4) = 0;
                    uVar38 = local_1240;
                  }
                  else {
                    stack0xffffffffffffece8 = pRVar35->args;
                    if (pRVar35->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar27 = pRVar35->user;
                      if (((Geometry *)context)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        auVar156._0_4_ = *(float *)(local_1178 + (long)pRVar40 * 4);
                        auVar74._0_4_ = *(float *)(local_1168 + (long)pRVar40 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1158 + (long)pRVar40 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1148 + (long)pRVar40 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1138 + (long)pRVar40 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_1128 + (long)pRVar40 * 4);
                        ray->u = auVar156._0_4_;
                        ray->v = auVar74._0_4_;
                        uVar136 = *(uint *)((long)&local_11f8 + (long)pRVar40 * 4);
                        context = (RayQueryContext *)(ulong)uVar136;
                        ray->primID = uVar136;
                        ray->geomID = uVar28;
                        ray->instID[0] = pRVar27->instID[0];
                        ray->instPrimID[0] = pRVar27->instPrimID[0];
                        uVar39 = local_1230;
                        break;
                      }
                    }
                    else {
                      pRVar27 = pRVar35->user;
                    }
                    fStack_12fc = auVar74._12_4_;
                    fStack_1300 = auVar74._8_4_;
                    fStack_1304 = auVar74._4_4_;
                    local_1308 = auVar74._0_4_;
                    local_1288 = *(float *)(local_1148 + (long)pRVar40 * 4);
                    local_1284 = *(undefined4 *)(local_1138 + (long)pRVar40 * 4);
                    local_1280 = *(undefined4 *)(local_1128 + (long)pRVar40 * 4);
                    local_127c = *(undefined4 *)(local_1178 + (long)pRVar40 * 4);
                    local_1278 = *(undefined4 *)(local_1168 + (long)pRVar40 * 4);
                    local_1274 = *(undefined4 *)((long)&local_11f8 + (long)pRVar40 * 4);
                    local_1270 = uVar28;
                    local_126c = pRVar27->instID[0];
                    local_1268 = pRVar27->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1158 + (long)pRVar40 * 4);
                    local_131c._0_4_ = -NAN;
                    local_12c8.valid = (int *)local_131c;
                    local_12c8.geometryUserPtr = ((Geometry *)context)->userPtr;
                    local_12c8.context = pRVar27;
                    local_12c8.ray = (RTCRayN *)ray;
                    local_12c8.hit = (RTCHitN *)&local_1288;
                    local_12c8.N = 1;
                    local_12d8 = pSVar33;
                    if (((((Geometry *)context)->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*((Geometry *)context)->intersectionFilterN)(&local_12c8),
                        pGVar29 = extraout_RDX_01, ray = local_12f8, pRVar35 = local_12f0,
                        (((RayK<1> *)local_12c8.valid)->org).field_0.m128[0] != 0.0)) &&
                       (((*(RTCFilterFunctionN *)(stack0xffffffffffffece8 + 0x10) ==
                          (RTCFilterFunctionN)0x0 ||
                         (((*(byte *)stack0xffffffffffffece8 & 2) == 0 &&
                          (((((Geometry *)context)->field_8).field_0x2 & 0x40) == 0)))) ||
                        ((**(RTCFilterFunctionN *)(stack0xffffffffffffece8 + 0x10))(&local_12c8),
                        pGVar29 = extraout_RDX_02, ray = local_12f8, pRVar35 = local_12f0,
                        (((RayK<1> *)local_12c8.valid)->org).field_0.m128[0] != 0.0)))) {
                      (((Vec3f *)((long)local_12c8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_12c8.hit;
                      (((Vec3f *)((long)local_12c8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_12c8.hit + 4);
                      (((Vec3f *)((long)local_12c8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_12c8.hit + 8);
                      *(float *)((long)local_12c8.ray + 0x3c) = *(float *)(local_12c8.hit + 0xc);
                      *(float *)((long)local_12c8.ray + 0x40) = *(float *)(local_12c8.hit + 0x10);
                      *(float *)((long)local_12c8.ray + 0x44) = *(float *)(local_12c8.hit + 0x14);
                      *(float *)((long)local_12c8.ray + 0x48) = *(float *)(local_12c8.hit + 0x18);
                      pGVar29 = (Geometry *)(ulong)(uint)*(float *)(local_12c8.hit + 0x1c);
                      *(float *)((long)local_12c8.ray + 0x4c) = *(float *)(local_12c8.hit + 0x1c);
                      *(float *)((long)local_12c8.ray + 0x50) = *(float *)(local_12c8.hit + 0x20);
                      pRVar23 = (RayHit *)local_12c8.ray;
                    }
                    else {
                      (local_12f8->super_RayK<1>).tfar = local_1308;
                      pRVar23 = (RayHit *)local_12c8.valid;
                      ray = local_12f8;
                      pRVar35 = local_12f0;
                    }
                    pSVar33 = local_12d8;
                    uVar28 = (uint)pRVar23;
                    *(undefined4 *)(local_12e8 + (long)pRVar40 * 4) = 0;
                    auVar74._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar74._4_4_ = (float)(ray->super_RayK<1>).mask;
                    auVar74._8_4_ = (float)(ray->super_RayK<1>).id;
                    auVar74._12_4_ = (float)(ray->super_RayK<1>).flags;
                    local_12e8._0_4_ = -(uint)(auVar108._0_4_ <= auVar74._0_4_) & local_12e8._0_4_;
                    local_12e8._4_4_ = -(uint)(auVar108._4_4_ <= auVar74._0_4_) & local_12e8._4_4_;
                    local_12e8._8_4_ = -(uint)(auVar108._8_4_ <= auVar74._0_4_) & local_12e8._8_4_;
                    fStack_12dc = (float)(-(uint)(auVar108._12_4_ <= auVar74._0_4_) &
                                         (uint)fStack_12dc);
                    uVar26 = extractps(auVar74,1);
                    uVar136 = (uint)uVar26;
                    context = (RayQueryContext *)pGVar29;
                  }
                  iVar19 = movmskps(uVar28,_local_12e8);
                  uVar39 = local_1230;
                  if (iVar19 == 0) break;
                  uVar39 = (ulong)uVar136;
                  local_1308 = auVar74._0_4_;
                  fStack_1304 = auVar74._4_4_;
                  fStack_1300 = auVar74._8_4_;
                  fStack_12fc = auVar74._12_4_;
                  BVHNIntersector1<4,1,true,embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  ray = local_12f8;
                  lVar32 = local_1298;
                  pRVar35 = local_12f0;
                  pRVar40 = (RayHit *)local_12c8.valid;
                  auVar74._0_4_ = local_1308;
                  auVar74._4_4_ = fStack_1304;
                  auVar74._8_4_ = fStack_1300;
                  auVar74._12_4_ = fStack_12fc;
                } while( true );
              }
            }
            local_10a0 = local_10a0 + 1;
          } while (local_10a0 != local_10a8);
        }
        auVar156._0_4_ = (ray->super_RayK<1>).tfar;
        auVar124._4_4_ = auVar156._0_4_;
        auVar124._0_4_ = auVar156._0_4_;
        auVar124._8_4_ = auVar156._0_4_;
        auVar124._12_4_ = auVar156._0_4_;
        fVar88 = local_1018;
        fVar89 = fStack_1014;
        fVar90 = fStack_1010;
        auVar156._0_4_ = fStack_100c;
        fVar97 = local_1058;
        fVar106 = fStack_1054;
        fVar109 = fStack_1050;
        auVar74._8_4_ = fStack_104c;
        fVar122 = local_1088;
        auVar74._0_4_ = fStack_1084;
        fVar66 = fStack_1080;
        fVar67 = fStack_107c;
        fVar129 = local_1098;
        fVar78 = fStack_1094;
        fVar79 = fStack_1090;
        fVar80 = fStack_108c;
        fVar110 = local_1008;
        fVar111 = fStack_1004;
        fVar112 = fStack_1000;
        auVar74._12_4_ = fStack_ffc;
        fVar113 = local_1028;
        fVar116 = fStack_1024;
        fVar117 = fStack_1020;
        fVar132 = fStack_101c;
        fVar118 = local_1038;
        fVar119 = fStack_1034;
        fVar120 = fStack_1030;
        fVar142 = fStack_102c;
        fVar123 = local_1048;
        fVar130 = fStack_1044;
        fVar131 = fStack_1040;
        auVar74._4_4_ = fStack_103c;
        fVar133 = local_1068;
        fVar134 = fStack_1064;
        fVar143 = fStack_1060;
        fVar135 = fStack_105c;
        fVar147 = local_1078;
        fVar148 = fStack_1074;
        fVar149 = fStack_1070;
        fVar140 = fStack_106c;
      }
    } while (pauVar21 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }